

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O3

size_t HUF_readDTableX2_wksp
                 (HUF_DTable *DTable,void *src,size_t srcSize,void *workSpace,size_t wkspSize)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  byte bVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  size_t sVar11;
  U32 nbSymbols;
  U32 tableLog;
  U32 local_20;
  U32 local_1c;
  
  local_1c = 0;
  local_20 = 0;
  sVar11 = 0xffffffffffffffd4;
  if (((0x13f < wkspSize) &&
      (sVar3 = HUF_readStats((BYTE *)((long)workSpace + 0x40),0x100,(U32 *)workSpace,&local_20,
                             &local_1c,src,srcSize), sVar11 = sVar3, sVar3 < 0xffffffffffffff89)) &&
     (uVar1 = *DTable, sVar11 = 0xffffffffffffffd4, local_1c <= (uVar1 & 0xff) + 1)) {
    *(char *)DTable = (char)uVar1;
    *(undefined1 *)((long)DTable + 1) = 0;
    *(char *)((long)DTable + 2) = (char)local_1c;
    *(char *)((long)DTable + 3) = (char)(uVar1 >> 0x18);
    if (local_1c != 0) {
      lVar5 = 0;
      iVar8 = 0;
      do {
        iVar2 = *(int *)((long)workSpace + lVar5 * 4 + 4);
        bVar4 = (byte)lVar5;
        *(int *)((long)workSpace + lVar5 * 4 + 4) = iVar8;
        lVar5 = lVar5 + 1;
        iVar8 = (iVar2 << (bVar4 & 0x1f)) + iVar8;
      } while (local_1c != (uint)lVar5);
    }
    sVar11 = sVar3;
    if ((ulong)local_20 != 0) {
      uVar7 = 0;
      do {
        bVar4 = *(byte *)((long)workSpace + uVar7 + 0x40);
        uVar6 = (ulong)bVar4;
        iVar8 = (1 << (bVar4 & 0x1f)) >> 1;
        uVar1 = *(uint *)((long)workSpace + uVar6 * 4);
        uVar9 = (ulong)uVar1;
        uVar10 = uVar1 + iVar8;
        if (uVar1 < uVar10) {
          do {
            *(char *)((long)DTable + uVar9 * 2 + 4) = (char)uVar7;
            *(byte *)((long)DTable + uVar9 * 2 + 5) = ((char)local_1c + '\x01') - bVar4;
            uVar9 = uVar9 + 1;
            uVar10 = *(int *)((long)workSpace + uVar6 * 4) + iVar8;
          } while (uVar9 < uVar10);
        }
        *(uint *)((long)workSpace + uVar6 * 4) = uVar10;
        uVar7 = uVar7 + 1;
      } while (uVar7 != local_20);
    }
  }
  return sVar11;
}

Assistant:

size_t HUF_readDTableX2_wksp(HUF_DTable* DTable, const void* src, size_t srcSize, void* workSpace, size_t wkspSize)
{
    U32 tableLog = 0;
    U32 nbSymbols = 0;
    size_t iSize;
    void* const dtPtr = DTable + 1;
    HUF_DEltX2* const dt = (HUF_DEltX2*)dtPtr;

    U32* rankVal;
    BYTE* huffWeight;
    size_t spaceUsed32 = 0;

    rankVal = (U32 *)workSpace + spaceUsed32;
    spaceUsed32 += HUF_TABLELOG_ABSOLUTEMAX + 1;
    huffWeight = (BYTE *)((U32 *)workSpace + spaceUsed32);
    spaceUsed32 += HUF_ALIGN(HUF_SYMBOLVALUE_MAX + 1, sizeof(U32)) >> 2;

    if ((spaceUsed32 << 2) > wkspSize) return ERROR(tableLog_tooLarge);

    HUF_STATIC_ASSERT(sizeof(DTableDesc) == sizeof(HUF_DTable));
    /* memset(huffWeight, 0, sizeof(huffWeight)); */   /* is not necessary, even though some analyzer complain ... */

    iSize = HUF_readStats(huffWeight, HUF_SYMBOLVALUE_MAX + 1, rankVal, &nbSymbols, &tableLog, src, srcSize);
    if (HUF_isError(iSize)) return iSize;

    /* Table header */
    {   DTableDesc dtd = HUF_getDTableDesc(DTable);
        if (tableLog > (U32)(dtd.maxTableLog+1)) return ERROR(tableLog_tooLarge);   /* DTable too small, Huffman tree cannot fit in */
        dtd.tableType = 0;
        dtd.tableLog = (BYTE)tableLog;
        memcpy(DTable, &dtd, sizeof(dtd));
    }

    /* Calculate starting value for each rank */
    {   U32 n, nextRankStart = 0;
        for (n=1; n<tableLog+1; n++) {
            U32 const current = nextRankStart;
            nextRankStart += (rankVal[n] << (n-1));
            rankVal[n] = current;
    }   }

    /* fill DTable */
    {   U32 n;
        for (n=0; n<nbSymbols; n++) {
            U32 const w = huffWeight[n];
            U32 const length = (1 << w) >> 1;
            U32 u;
            HUF_DEltX2 D;
            D.byte = (BYTE)n; D.nbBits = (BYTE)(tableLog + 1 - w);
            for (u = rankVal[w]; u < rankVal[w] + length; u++)
                dt[u] = D;
            rankVal[w] += length;
    }   }

    return iSize;
}